

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O1

bool __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadAttribute<bool>(OgreXmlSerializer *this,char *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  XmlReader *reader;
  _Alloc_hider _Var2;
  size_type sVar3;
  int iVar4;
  long *plVar5;
  size_type *psVar6;
  size_type sVar7;
  bool bVar8;
  bool bVar9;
  string value;
  allocator<char> local_d1;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ReadAttribute<std::__cxx11::string>(&local_90,this,name);
  sVar3 = local_90._M_string_length;
  _Var2._M_p = local_90._M_dataplus._M_p;
  if (local_90._M_string_length != 0) {
    sVar7 = 0;
    do {
      iVar4 = tolower((int)_Var2._M_p[sVar7]);
      _Var2._M_p[sVar7] = (char)iVar4;
      sVar7 = sVar7 + 1;
    } while (sVar3 != sVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == &local_90.field_2) {
    local_b0.field_2._8_4_ = local_90.field_2._8_4_;
    local_b0.field_2._12_4_ = local_90.field_2._12_4_;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0._M_dataplus._M_p = local_90._M_dataplus._M_p;
  }
  local_b0.field_2._M_allocated_capacity._4_4_ = local_90.field_2._M_allocated_capacity._4_4_;
  local_b0.field_2._M_allocated_capacity._0_4_ = local_90.field_2._M_allocated_capacity._0_4_;
  local_b0._M_string_length = local_90._M_string_length;
  local_90._M_string_length = 0;
  local_90.field_2._M_allocated_capacity._0_4_ =
       local_90.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  paVar1 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"true","");
  if ((int)local_d0._M_string_length == (int)local_b0._M_string_length) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_0043652a;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_00436549;
    iVar4 = strcasecmp(local_b0._M_dataplus._M_p,local_d0._M_dataplus._M_p);
    bVar8 = iVar4 == 0;
  }
  else {
    bVar8 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (bVar8 == false) {
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"false","");
    if ((int)local_d0._M_string_length == (int)local_b0._M_string_length) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
LAB_0043652a:
        __assert_fail("__null != s1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/StringComparison.h"
                      ,0x8f,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
LAB_00436549:
        __assert_fail("__null != s2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/StringComparison.h"
                      ,0x90,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
      }
      iVar4 = strcasecmp(local_b0._M_dataplus._M_p,local_d0._M_dataplus._M_p);
      bVar9 = iVar4 == 0;
    }
    else {
      bVar9 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (!bVar9) {
      reader = this->m_reader;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,name,&local_d1);
      std::operator+(&local_50,
                     "Boolean value is expected to be \'true\' or \'false\', encountered \'",
                     &local_b0);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_70._M_dataplus._M_p = (pointer)*plVar5;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_70._M_dataplus._M_p == psVar6) {
        local_70.field_2._M_allocated_capacity = *psVar6;
        local_70.field_2._8_8_ = plVar5[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar6;
      }
      local_70._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      ThrowAttibuteError(reader,&local_d0,&local_70);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return bVar8;
}

Assistant:

bool OgreXmlSerializer::ReadAttribute<bool>(const char *name) const
{
    std::string value = Ogre::ToLower(ReadAttribute<std::string>(name));
    if (ASSIMP_stricmp(value, "true") == 0)
    {
        return true;
    }
    else if (ASSIMP_stricmp(value, "false") == 0)
    {
        return false;
    }
    else
    {
        ThrowAttibuteError(m_reader, name, "Boolean value is expected to be 'true' or 'false', encountered '" + value + "'");
        return false;
    }
}